

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O1

void deqp::gls::ub::anon_unknown_12::generateDeclaration(ostringstream *src,UniformBlock *block)

{
  char *pcVar1;
  ulong in_RAX;
  size_t sVar2;
  ostream *poVar3;
  pointer pUVar4;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if ((block->m_flags & 0xf8) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>,"layout(",7);
    local_38 = CONCAT44(block->m_flags,local_38._0_4_) & 0xf8ffffffff;
    ub::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,
                   (LayoutFlagsFmt *)((long)&local_38 + 4));
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>,") ",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&src->super_basic_ostream<char,_std::char_traits<char>_>,"uniform ",8);
  pcVar1 = (block->m_blockName)._M_dataplus._M_p;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)src +
                    (int)(src->super_basic_ostream<char,_std::char_traits<char>_>).
                         _vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&src->super_basic_ostream<char,_std::char_traits<char>_>,"\n{\n",3);
  pUVar4 = (block->m_uniforms).
           super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pUVar4 != (block->m_uniforms).
                super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (&src->super_basic_ostream<char,_std::char_traits<char>_>,"\t",1);
      if ((pUVar4->m_flags & 0xf8) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&src->super_basic_ostream<char,_std::char_traits<char>_>,"layout(",7);
        local_38 = CONCAT44(local_38._4_4_,pUVar4->m_flags) & 0xffffffff000000f8;
        ub::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,
                       (LayoutFlagsFmt *)&local_38);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&src->super_basic_ostream<char,_std::char_traits<char>_>,") ",2);
      }
      generateDeclaration(src,&pUVar4->m_type,(pUVar4->m_name)._M_dataplus._M_p,1,
                          pUVar4->m_flags & 0xc00);
      pUVar4 = pUVar4 + 1;
    } while (pUVar4 != (block->m_uniforms).
                       super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&src->super_basic_ostream<char,_std::char_traits<char>_>,"}",1);
  if (((block->m_instanceName)._M_string_length != 0) &&
     ((block->m_instanceName)._M_dataplus._M_p != (pointer)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&src->super_basic_ostream<char,_std::char_traits<char>_>," ",1);
    pcVar1 = (block->m_instanceName)._M_dataplus._M_p;
    if (pcVar1 == (char *)0x0 || (block->m_instanceName)._M_string_length == 0) {
      std::ios::clear((int)src +
                      (int)(src->super_basic_ostream<char,_std::char_traits<char>_>).
                           _vptr_basic_ostream[-3]);
    }
    else {
      sVar2 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                (&src->super_basic_ostream<char,_std::char_traits<char>_>,pcVar1,sVar2);
    }
    if (0 < block->m_arraySize) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&src->super_basic_ostream<char,_std::char_traits<char>_>,"[",1);
      poVar3 = (ostream *)std::ostream::operator<<(src,block->m_arraySize);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&src->super_basic_ostream<char,_std::char_traits<char>_>,";\n",2);
  return;
}

Assistant:

void generateDeclaration (std::ostringstream& src, const UniformBlock& block)
{
	if ((block.getFlags() & LAYOUT_MASK) != 0)
		src << "layout(" << LayoutFlagsFmt(block.getFlags() & LAYOUT_MASK) << ") ";

	src << "uniform " << block.getBlockName();
	src << "\n{\n";

	for (UniformBlock::ConstIterator uniformIter = block.begin(); uniformIter != block.end(); uniformIter++)
	{
		src << Indent(1);
		generateDeclaration(src, *uniformIter, 1 /* indent level */);
	}

	src << "}";

	if (block.getInstanceName() != DE_NULL)
	{
		src << " " << block.getInstanceName();
		if (block.isArray())
			src << "[" << block.getArraySize() << "]";
	}
	else
		DE_ASSERT(!block.isArray());

	src << ";\n";
}